

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streamvbyte.c
# Opt level: O3

uint8_t * svb_decode_avx_d1_init
                    (uint32_t *out,uint8_t *keyPtr,uint8_t *dataPtr,uint64_t count,uint32_t prev)

{
  byte bVar1;
  undefined1 auVar2 [16];
  long lVar3;
  long lVar4;
  byte bVar6;
  uint8_t *puVar5;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  
  if (0x1f < count) {
    auVar13 = vpbroadcastd_avx512vl();
    uVar7 = *(ulong *)keyPtr;
    if (count >> 5 != 1) {
      uVar8 = 1;
      uVar10 = uVar7;
      do {
        uVar7 = *(ulong *)(keyPtr + uVar8 * 8);
        auVar13 = vpshufd_avx(auVar13,0xff);
        if (uVar10 == 0) {
          auVar15 = vlddqu_avx(*(undefined1 (*) [16])dataPtr);
          auVar15 = vpmovzxbw_avx(auVar15);
          auVar14 = vpslldq_avx(auVar15,2);
          auVar15 = vpaddd_avx(auVar14,auVar15);
          auVar14 = vpslldq_avx(auVar15,4);
          auVar15 = vpaddd_avx(auVar15,auVar14);
          auVar14 = vpmovzxwd_avx(auVar15);
          auVar15 = vpunpckhwd_avx(auVar15,(undefined1  [16])0x0);
          auVar13 = vpaddd_avx(auVar13,auVar14);
          auVar15 = vpaddd_avx(auVar13,auVar15);
          *(undefined1 (*) [16])out = auVar13;
          *(undefined1 (*) [16])((long)out + 0x10) = auVar15;
          auVar14 = vpshufd_avx(auVar15,0xff);
          auVar13 = vlddqu_avx(*(undefined1 (*) [16])(*(undefined1 (*) [16])dataPtr + 8));
          auVar13 = vpmovzxbw_avx(auVar13);
          auVar15 = vpslldq_avx(auVar13,2);
          auVar13 = vpaddd_avx(auVar15,auVar13);
          auVar15 = vpslldq_avx(auVar13,4);
          auVar13 = vpaddd_avx(auVar13,auVar15);
          auVar15 = vpmovzxwd_avx(auVar13);
          auVar2 = vpunpckhwd_avx(auVar13,(undefined1  [16])0x0);
          auVar13 = vpaddd_avx(auVar14,auVar15);
          auVar15 = vpaddd_avx(auVar13,auVar2);
          *(undefined1 (*) [16])((long)out + 0x20) = auVar13;
          *(undefined1 (*) [16])((long)out + 0x30) = auVar15;
          auVar14 = vpshufd_avx(auVar15,0xff);
          auVar13 = vlddqu_avx(*(undefined1 (*) [16])((long)dataPtr + 0x10));
          auVar13 = vpmovzxbw_avx(auVar13);
          auVar15 = vpslldq_avx(auVar13,2);
          auVar13 = vpaddd_avx(auVar15,auVar13);
          auVar15 = vpslldq_avx(auVar13,4);
          auVar13 = vpaddd_avx(auVar13,auVar15);
          auVar15 = vpmovzxwd_avx(auVar13);
          auVar2 = vpunpckhwd_avx(auVar13,(undefined1  [16])0x0);
          auVar13 = vpaddd_avx(auVar14,auVar15);
          auVar15 = vpaddd_avx(auVar13,auVar2);
          *(undefined1 (*) [16])((long)out + 0x40) = auVar13;
          *(undefined1 (*) [16])((long)out + 0x50) = auVar15;
          auVar14 = vpshufd_avx(auVar15,0xff);
          auVar13 = vlddqu_avx(*(undefined1 (*) [16])
                                (*(undefined1 (*) [16])((long)dataPtr + 0x10) + 8));
          dataPtr = (uint8_t *)((long)dataPtr + 0x20);
          auVar13 = vpmovzxbw_avx(auVar13);
          auVar15 = vpslldq_avx(auVar13,2);
          auVar13 = vpaddd_avx(auVar15,auVar13);
          auVar15 = vpslldq_avx(auVar13,4);
          auVar13 = vpaddd_avx(auVar13,auVar15);
          auVar15 = vpmovzxwd_avx(auVar13);
          auVar13 = vpunpckhwd_avx(auVar13,(undefined1  [16])0x0);
          auVar15 = vpaddd_avx(auVar14,auVar15);
          auVar13 = vpaddd_avx(auVar15,auVar13);
          *(undefined1 (*) [16])((long)out + 0x60) = auVar15;
        }
        else {
          bVar6 = (byte)(uVar10 >> 8);
          uVar12 = (ulong)"\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                          [uVar10 & 0xff];
          auVar15 = vpshufb_avx(*(undefined1 (*) [16])dataPtr,
                                *(undefined1 (*) [16])
                                 (shuffleTable[0] + (uint)((int)(uVar10 & 0xff) << 4)));
          auVar14 = vpslldq_avx(auVar15,4);
          auVar15 = vpaddd_avx(auVar14,auVar15);
          auVar13 = vpaddd_avx(auVar15,auVar13);
          auVar15 = vpslldq_avx(auVar15,8);
          auVar13 = vpaddd_avx(auVar13,auVar15);
          *(undefined1 (*) [16])out = auVar13;
          auVar15 = vpshufd_avx(auVar13,0xff);
          bVar1 = "\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                  [bVar6];
          auVar13 = vpshufb_avx(*(undefined1 (*) [16])(*(undefined1 (*) [16])dataPtr + uVar12),
                                (undefined1  [16])shuffleTable[bVar6]);
          uVar9 = (uint)uVar10 >> 0x10 & 0xff;
          lVar3 = bVar1 + uVar12;
          auVar14 = vpslldq_avx(auVar13,4);
          auVar13 = vpaddd_avx(auVar14,auVar13);
          auVar15 = vpaddd_avx(auVar13,auVar15);
          auVar13 = vpslldq_avx(auVar13,8);
          auVar13 = vpaddd_avx(auVar15,auVar13);
          *(undefined1 (*) [16])((long)out + 0x10) = auVar13;
          auVar15 = vpshufd_avx(auVar13,0xff);
          bVar6 = "\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                  [uVar9];
          uVar11 = uVar10 >> 0x18 & 0xff;
          auVar13 = vpshufb_avx(*(undefined1 (*) [16])
                                 (*(undefined1 (*) [16])dataPtr + bVar1 + uVar12),
                                *(undefined1 (*) [16])(shuffleTable[0] + (uVar9 << 4)));
          lVar4 = (ulong)bVar6 + lVar3;
          auVar14 = vpslldq_avx(auVar13,4);
          auVar13 = vpaddd_avx(auVar14,auVar13);
          auVar14 = vpslldq_avx(auVar13,8);
          auVar13 = vpaddd_avx(auVar13,auVar14);
          auVar13 = vpaddd_avx(auVar13,auVar15);
          *(undefined1 (*) [16])((long)out + 0x20) = auVar13;
          auVar15 = vpshufd_avx(auVar13,0xff);
          bVar1 = "\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                  [uVar11];
          auVar13 = vpshufb_avx(*(undefined1 (*) [16])
                                 (*(undefined1 (*) [16])dataPtr + (ulong)bVar6 + lVar3),
                                *(undefined1 (*) [16])(shuffleTable[0] + (uint)((int)uVar11 << 4)));
          uVar12 = uVar10 >> 0x20 & 0xff;
          lVar3 = (ulong)bVar1 + lVar4;
          auVar14 = vpslldq_avx(auVar13,4);
          auVar13 = vpaddd_avx(auVar14,auVar13);
          auVar14 = vpslldq_avx(auVar13,8);
          auVar13 = vpaddd_avx(auVar13,auVar14);
          auVar13 = vpaddd_avx(auVar13,auVar15);
          *(undefined1 (*) [16])((long)out + 0x30) = auVar13;
          auVar15 = vpshufd_avx(auVar13,0xff);
          bVar6 = "\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                  [uVar12];
          auVar13 = vpshufb_avx(*(undefined1 (*) [16])
                                 (*(undefined1 (*) [16])dataPtr + (ulong)bVar1 + lVar4),
                                *(undefined1 (*) [16])(shuffleTable[0] + (uint)((int)uVar12 << 4)));
          uVar12 = uVar10 >> 0x28 & 0xff;
          lVar4 = (ulong)bVar6 + lVar3;
          auVar14 = vpslldq_avx(auVar13,4);
          auVar13 = vpaddd_avx(auVar14,auVar13);
          auVar14 = vpslldq_avx(auVar13,8);
          auVar13 = vpaddd_avx(auVar13,auVar14);
          auVar13 = vpaddd_avx(auVar13,auVar15);
          *(undefined1 (*) [16])((long)out + 0x40) = auVar13;
          auVar15 = vpshufd_avx(auVar13,0xff);
          bVar1 = "\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                  [uVar12];
          auVar13 = vpshufb_avx(*(undefined1 (*) [16])
                                 (*(undefined1 (*) [16])dataPtr + (ulong)bVar6 + lVar3),
                                *(undefined1 (*) [16])(shuffleTable[0] + (uint)((int)uVar12 << 4)));
          uVar12 = uVar10 >> 0x30 & 0xff;
          lVar3 = (ulong)bVar1 + lVar4;
          auVar14 = vpslldq_avx(auVar13,4);
          auVar13 = vpaddd_avx(auVar14,auVar13);
          auVar14 = vpslldq_avx(auVar13,8);
          auVar13 = vpaddd_avx(auVar13,auVar14);
          auVar13 = vpaddd_avx(auVar13,auVar15);
          *(undefined1 (*) [16])((long)out + 0x50) = auVar13;
          auVar15 = vpshufd_avx(auVar13,0xff);
          bVar6 = "\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                  [uVar12];
          auVar13 = vpshufb_avx(*(undefined1 (*) [16])
                                 (*(undefined1 (*) [16])dataPtr + (ulong)bVar1 + lVar4),
                                *(undefined1 (*) [16])(shuffleTable[0] + (uint)((int)uVar12 << 4)));
          auVar14 = vpslldq_avx(auVar13,4);
          auVar13 = vpaddd_avx(auVar14,auVar13);
          auVar14 = vpslldq_avx(auVar13,8);
          auVar13 = vpaddd_avx(auVar13,auVar14);
          auVar13 = vpaddd_avx(auVar13,auVar15);
          *(undefined1 (*) [16])((long)out + 0x60) = auVar13;
          auVar15 = vpshufd_avx(auVar13,0xff);
          auVar13 = vpshufb_avx(*(undefined1 (*) [16])
                                 (*(undefined1 (*) [16])dataPtr + (ulong)bVar6 + lVar3),
                                (undefined1  [16])shuffleTable[uVar10 >> 0x38]);
          dataPtr = *(undefined1 (*) [16])dataPtr +
                    (ulong)"\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                           [uVar10 >> 0x38] + (ulong)bVar6 + lVar3;
          auVar14 = vpslldq_avx(auVar13,4);
          auVar13 = vpaddd_avx(auVar14,auVar13);
          auVar14 = vpslldq_avx(auVar13,8);
          auVar13 = vpaddd_avx(auVar13,auVar14);
          auVar13 = vpaddd_avx(auVar13,auVar15);
        }
        *(undefined1 (*) [16])((long)out + 0x70) = auVar13;
        out = (uint32_t *)((long)out + 0x80);
        uVar8 = uVar8 + 1;
        uVar10 = uVar7;
      } while (count >> 5 != uVar8);
    }
    if (uVar7 == 0) {
      auVar15 = vlddqu_avx(*(undefined1 (*) [16])dataPtr);
      auVar14 = vpshufd_avx(auVar13,0xff);
      auVar13 = vpmovzxbw_avx(auVar15);
      auVar15 = vpslldq_avx(auVar13,2);
      auVar13 = vpaddd_avx(auVar15,auVar13);
      auVar15 = vpslldq_avx(auVar13,4);
      auVar13 = vpaddd_avx(auVar13,auVar15);
      auVar15 = vpmovzxwd_avx(auVar13);
      auVar15 = vpaddd_avx(auVar14,auVar15);
      auVar13 = vpunpckhwd_avx(auVar13,(undefined1  [16])0x0);
      *(undefined1 (*) [16])out = auVar15;
      auVar13 = vpaddd_avx(auVar15,auVar13);
      *(undefined1 (*) [16])((long)out + 0x10) = auVar13;
      auVar14 = vpshufd_avx(auVar13,0xff);
      auVar13 = vlddqu_avx(*(undefined1 (*) [16])(*(undefined1 (*) [16])dataPtr + 8));
      auVar13 = vpmovzxbw_avx(auVar13);
      auVar15 = vpslldq_avx(auVar13,2);
      auVar13 = vpaddd_avx(auVar15,auVar13);
      auVar15 = vpslldq_avx(auVar13,4);
      auVar13 = vpaddd_avx(auVar13,auVar15);
      auVar15 = vpmovzxwd_avx(auVar13);
      auVar2 = vpunpckhwd_avx(auVar13,(undefined1  [16])0x0);
      auVar13 = vpaddd_avx(auVar14,auVar15);
      auVar15 = vpaddd_avx(auVar13,auVar2);
      *(undefined1 (*) [16])((long)out + 0x20) = auVar13;
      *(undefined1 (*) [16])((long)out + 0x30) = auVar15;
      auVar14 = vpshufd_avx(auVar15,0xff);
      auVar13 = vlddqu_avx(*(undefined1 (*) [16])((long)dataPtr + 0x10));
      auVar13 = vpmovzxbw_avx(auVar13);
      auVar15 = vpslldq_avx(auVar13,2);
      auVar13 = vpaddd_avx(auVar15,auVar13);
      auVar15 = vpslldq_avx(auVar13,4);
      auVar13 = vpaddd_avx(auVar13,auVar15);
      auVar15 = vpmovzxwd_avx(auVar13);
      auVar2 = vpunpckhwd_avx(auVar13,(undefined1  [16])0x0);
      auVar13 = vpaddd_avx(auVar14,auVar15);
      auVar15 = vpaddd_avx(auVar13,auVar2);
      *(undefined1 (*) [16])((long)out + 0x40) = auVar13;
      *(undefined1 (*) [16])((long)out + 0x50) = auVar15;
      auVar14 = vpshufd_avx(auVar15,0xff);
      auVar13._8_8_ = 0;
      auVar13._0_8_ = *(ulong *)(*(undefined1 (*) [16])((long)dataPtr + 0x10) + 8);
      auVar13 = vpmovzxbw_avx(auVar13);
      dataPtr = (uint8_t *)((long)dataPtr + 0x20);
      auVar15 = vpslldq_avx(auVar13,2);
      auVar13 = vpaddd_avx(auVar15,auVar13);
      auVar15 = vpslldq_avx(auVar13,4);
      auVar13 = vpaddd_avx(auVar13,auVar15);
      auVar15 = vpmovzxwd_avx(auVar13);
      auVar15 = vpaddd_avx(auVar14,auVar15);
      auVar13 = vpunpckhwd_avx(auVar13,(undefined1  [16])0x0);
      auVar13 = vpaddd_avx(auVar15,auVar13);
      *(undefined1 (*) [16])((long)out + 0x60) = auVar15;
    }
    else {
      auVar15 = vpshufd_avx(auVar13,0xff);
      bVar6 = (byte)(uVar7 >> 8);
      uVar10 = (ulong)"\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                      [uVar7 & 0xff];
      auVar13 = vpshufb_avx(*(undefined1 (*) [16])dataPtr,
                            *(undefined1 (*) [16])
                             (shuffleTable[0] + (uint)((int)(uVar7 & 0xff) << 4)));
      auVar14 = vpslldq_avx(auVar13,4);
      auVar13 = vpaddd_avx(auVar14,auVar13);
      auVar15 = vpaddd_avx(auVar13,auVar15);
      auVar13 = vpslldq_avx(auVar13,8);
      auVar13 = vpaddd_avx(auVar15,auVar13);
      *(undefined1 (*) [16])out = auVar13;
      auVar15 = vpshufd_avx(auVar13,0xff);
      bVar1 = "\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
              [bVar6];
      auVar13 = vpshufb_avx(*(undefined1 (*) [16])(*(undefined1 (*) [16])dataPtr + uVar10),
                            (undefined1  [16])shuffleTable[bVar6]);
      uVar9 = (uint)uVar7 >> 0x10 & 0xff;
      lVar3 = bVar1 + uVar10;
      auVar14 = vpslldq_avx(auVar13,4);
      auVar13 = vpaddd_avx(auVar14,auVar13);
      auVar15 = vpaddd_avx(auVar13,auVar15);
      auVar13 = vpslldq_avx(auVar13,8);
      auVar13 = vpaddd_avx(auVar15,auVar13);
      *(undefined1 (*) [16])((long)out + 0x10) = auVar13;
      auVar15 = vpshufd_avx(auVar13,0xff);
      bVar6 = "\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
              [uVar9];
      auVar13 = vpshufb_avx(*(undefined1 (*) [16])(*(undefined1 (*) [16])dataPtr + bVar1 + uVar10),
                            *(undefined1 (*) [16])(shuffleTable[0] + (uVar9 << 4)));
      uVar10 = uVar7 >> 0x18 & 0xff;
      lVar4 = (ulong)bVar6 + lVar3;
      auVar14 = vpslldq_avx(auVar13,4);
      auVar13 = vpaddd_avx(auVar14,auVar13);
      auVar14 = vpslldq_avx(auVar13,8);
      auVar13 = vpaddd_avx(auVar13,auVar14);
      auVar13 = vpaddd_avx(auVar13,auVar15);
      *(undefined1 (*) [16])((long)out + 0x20) = auVar13;
      auVar15 = vpshufd_avx(auVar13,0xff);
      bVar1 = "\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
              [uVar10];
      auVar13 = vpshufb_avx(*(undefined1 (*) [16])
                             (*(undefined1 (*) [16])dataPtr + (ulong)bVar6 + lVar3),
                            *(undefined1 (*) [16])(shuffleTable[0] + (uint)((int)uVar10 << 4)));
      uVar10 = uVar7 >> 0x20 & 0xff;
      lVar3 = (ulong)bVar1 + lVar4;
      auVar14 = vpslldq_avx(auVar13,4);
      auVar13 = vpaddd_avx(auVar14,auVar13);
      auVar14 = vpslldq_avx(auVar13,8);
      auVar13 = vpaddd_avx(auVar13,auVar14);
      auVar13 = vpaddd_avx(auVar13,auVar15);
      *(undefined1 (*) [16])((long)out + 0x30) = auVar13;
      auVar15 = vpshufd_avx(auVar13,0xff);
      bVar6 = "\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
              [uVar10];
      auVar13 = vpshufb_avx(*(undefined1 (*) [16])
                             (*(undefined1 (*) [16])dataPtr + (ulong)bVar1 + lVar4),
                            *(undefined1 (*) [16])(shuffleTable[0] + (uint)((int)uVar10 << 4)));
      uVar10 = uVar7 >> 0x28 & 0xff;
      lVar4 = (ulong)bVar6 + lVar3;
      auVar14 = vpslldq_avx(auVar13,4);
      auVar13 = vpaddd_avx(auVar14,auVar13);
      auVar14 = vpslldq_avx(auVar13,8);
      auVar13 = vpaddd_avx(auVar13,auVar14);
      auVar13 = vpaddd_avx(auVar13,auVar15);
      *(undefined1 (*) [16])((long)out + 0x40) = auVar13;
      auVar15 = vpshufd_avx(auVar13,0xff);
      bVar1 = "\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
              [uVar10];
      auVar13 = vpshufb_avx(*(undefined1 (*) [16])
                             (*(undefined1 (*) [16])dataPtr + (ulong)bVar6 + lVar3),
                            *(undefined1 (*) [16])(shuffleTable[0] + (uint)((int)uVar10 << 4)));
      uVar10 = uVar7 >> 0x30 & 0xff;
      lVar3 = (ulong)bVar1 + lVar4;
      auVar14 = vpslldq_avx(auVar13,4);
      auVar13 = vpaddd_avx(auVar14,auVar13);
      auVar14 = vpslldq_avx(auVar13,8);
      auVar13 = vpaddd_avx(auVar13,auVar14);
      auVar13 = vpaddd_avx(auVar13,auVar15);
      *(undefined1 (*) [16])((long)out + 0x50) = auVar13;
      auVar15 = vpshufd_avx(auVar13,0xff);
      bVar6 = "\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
              [uVar10];
      auVar13 = vpshufb_avx(*(undefined1 (*) [16])
                             (*(undefined1 (*) [16])dataPtr + (ulong)bVar1 + lVar4),
                            *(undefined1 (*) [16])(shuffleTable[0] + (uint)((int)uVar10 << 4)));
      auVar14 = vpslldq_avx(auVar13,4);
      auVar13 = vpaddd_avx(auVar14,auVar13);
      auVar14 = vpslldq_avx(auVar13,8);
      auVar13 = vpaddd_avx(auVar13,auVar14);
      auVar13 = vpaddd_avx(auVar13,auVar15);
      *(undefined1 (*) [16])((long)out + 0x60) = auVar13;
      auVar15 = vpshufd_avx(auVar13,0xff);
      auVar13 = vpshufb_avx(*(undefined1 (*) [16])
                             (*(undefined1 (*) [16])dataPtr + (ulong)bVar6 + lVar3),
                            (undefined1  [16])shuffleTable[uVar7 >> 0x38]);
      dataPtr = *(undefined1 (*) [16])dataPtr +
                (ulong)"\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                       [uVar7 >> 0x38] + (ulong)bVar6 + lVar3;
      auVar14 = vpslldq_avx(auVar13,4);
      auVar13 = vpaddd_avx(auVar14,auVar13);
      auVar14 = vpslldq_avx(auVar13,8);
      auVar13 = vpaddd_avx(auVar13,auVar14);
      auVar13 = vpaddd_avx(auVar13,auVar15);
    }
    *(undefined1 (*) [16])((long)out + 0x70) = auVar13;
    out = (uint32_t *)((long)out + 0x80);
    prev = auVar13._12_4_;
  }
  puVar5 = svb_decode_scalar_d1_init(out,keyPtr + (count >> 5) * 8,dataPtr,(uint)count & 0x1f,prev);
  return puVar5;
}

Assistant:

uint8_t *svb_decode_avx_d1_init(uint32_t *out, uint8_t *__restrict__ keyPtr,
                                uint8_t *__restrict__ dataPtr, uint64_t count,
                                uint32_t prev) {
  uint64_t keybytes = count / 4; // number of key bytes
  if (keybytes >= 8) {
    xmm_t Prev = _mm_set1_epi32(prev);
    xmm_t Data;

    int64_t Offset = -(int64_t)keybytes / 8 + 1;

    const uint64_t *keyPtr64 = (const uint64_t *)keyPtr - Offset;
    uint64_t nextkeys = keyPtr64[Offset];
    for (; Offset != 0; ++Offset) {
      uint64_t keys = nextkeys;
      nextkeys = keyPtr64[Offset + 1];
      // faster 16-bit delta since we only have 8-bit values
      if (!keys) { // 32 1-byte ints in a row

        Data = _mm_cvtepu8_epi16(_mm_lddqu_si128((xmm_t *)(dataPtr)));
        Prev = _write_16bit_avx_d1(out, Data, Prev);
        Data = _mm_cvtepu8_epi16(_mm_lddqu_si128((xmm_t *)(dataPtr + 8)));
        Prev = _write_16bit_avx_d1(out + 8, Data, Prev);
        Data = _mm_cvtepu8_epi16(_mm_lddqu_si128((xmm_t *)(dataPtr + 16)));
        Prev = _write_16bit_avx_d1(out + 16, Data, Prev);
        Data = _mm_cvtepu8_epi16(_mm_lddqu_si128((xmm_t *)(dataPtr + 24)));
        Prev = _write_16bit_avx_d1(out + 24, Data, Prev);
        out += 32;
        dataPtr += 32;
        continue;
      }

      Data = _decode_avx(keys & 0x00FF, &dataPtr);
      Prev = _write_avx_d1(out, Data, Prev);
      Data = _decode_avx((keys & 0xFF00) >> 8, &dataPtr);
      Prev = _write_avx_d1(out + 4, Data, Prev);

      keys >>= 16;
      Data = _decode_avx((keys & 0x00FF), &dataPtr);
      Prev = _write_avx_d1(out + 8, Data, Prev);
      Data = _decode_avx((keys & 0xFF00) >> 8, &dataPtr);
      Prev = _write_avx_d1(out + 12, Data, Prev);

      keys >>= 16;
      Data = _decode_avx((keys & 0x00FF), &dataPtr);
      Prev = _write_avx_d1(out + 16, Data, Prev);
      Data = _decode_avx((keys & 0xFF00) >> 8, &dataPtr);
      Prev = _write_avx_d1(out + 20, Data, Prev);

      keys >>= 16;
      Data = _decode_avx((keys & 0x00FF), &dataPtr);
      Prev = _write_avx_d1(out + 24, Data, Prev);
      Data = _decode_avx((keys & 0xFF00) >> 8, &dataPtr);
      Prev = _write_avx_d1(out + 28, Data, Prev);

      out += 32;
    }
    {
      uint64_t keys = nextkeys;
      // faster 16-bit delta since we only have 8-bit values
      if (!keys) { // 32 1-byte ints in a row
        Data = _mm_cvtepu8_epi16(_mm_lddqu_si128((xmm_t *)(dataPtr)));
        Prev = _write_16bit_avx_d1(out, Data, Prev);
        Data = _mm_cvtepu8_epi16(_mm_lddqu_si128((xmm_t *)(dataPtr + 8)));
        Prev = _write_16bit_avx_d1(out + 8, Data, Prev);
        Data = _mm_cvtepu8_epi16(_mm_lddqu_si128((xmm_t *)(dataPtr + 16)));
        Prev = _write_16bit_avx_d1(out + 16, Data, Prev);
        Data = _mm_cvtepu8_epi16(_mm_loadl_epi64((xmm_t *)(dataPtr + 24)));
        _write_16bit_avx_d1(out + 24, Data, Prev);
        out += 32;
        dataPtr += 32;

      } else {

        Data = _decode_avx(keys & 0x00FF, &dataPtr);
        Prev = _write_avx_d1(out, Data, Prev);
        Data = _decode_avx((keys & 0xFF00) >> 8, &dataPtr);
        Prev = _write_avx_d1(out + 4, Data, Prev);

        keys >>= 16;
        Data = _decode_avx((keys & 0x00FF), &dataPtr);
        Prev = _write_avx_d1(out + 8, Data, Prev);
        Data = _decode_avx((keys & 0xFF00) >> 8, &dataPtr);
        Prev = _write_avx_d1(out + 12, Data, Prev);

        keys >>= 16;
        Data = _decode_avx((keys & 0x00FF), &dataPtr);
        Prev = _write_avx_d1(out + 16, Data, Prev);
        Data = _decode_avx((keys & 0xFF00) >> 8, &dataPtr);
        Prev = _write_avx_d1(out + 20, Data, Prev);

        keys >>= 16;
        Data = _decode_avx((keys & 0x00FF), &dataPtr);
        Prev = _write_avx_d1(out + 24, Data, Prev);
        Data = _decode_avx((keys & 0xFF00) >> 8, &dataPtr);
        _write_avx_d1(out + 28, Data, Prev);

        out += 32;
      }
    }
    prev = out[-1];
  }
  uint64_t consumedkeys = keybytes - (keybytes & 7);
  return svb_decode_scalar_d1_init(out, keyPtr + consumedkeys, dataPtr,
                                   count & 31, prev);
}